

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  uint32_t src0_stride_00;
  uint32_t dst_stride_00;
  uint mask_stride_00;
  int iVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  __m128i *unaff_RBX;
  undefined8 unaff_RBP;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  uint8_t *unaff_R14;
  CONV_BUF_TYPE *unaff_R15;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i *unaff_retaddr;
  int in_stack_00000008;
  uint32_t in_stack_0000000c;
  undefined4 in_stack_0000003c;
  __m256i y_round_offset;
  __m128i v_round_offset;
  int shift;
  int round_offset;
  int round_bits;
  int bd;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 uVar6;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  undefined3 in_stack_fffffffffffffed8;
  undefined1 local_120 [4];
  uint32_t in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  char cVar7;
  uint32_t src1_stride_00;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t src1_stride_01;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t src0_stride_01;
  uint32_t src1_stride_02;
  CONV_BUF_TYPE *src1_00;
  undefined8 local_80;
  CONV_BUF_TYPE *in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffac;
  CONV_BUF_TYPE *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar3 = -(*(int *)(CONCAT44(in_stack_0000003c,subh) + 0x14) +
           *(int *)(CONCAT44(in_stack_0000003c,subh) + 0x18));
  dst_stride_00 = iVar3 + 0xe;
  cVar7 = (char)dst_stride_00;
  mask_stride_00 =
       (((1 << (cVar7 + 8U & 0x1f)) + (1 << (cVar7 + 7U & 0x1f))) - (1 << (cVar7 - 1U & 0x1f))) *
       0x40;
  iVar3 = iVar3 + 0x14;
  auVar1 = vpinsrd_avx(ZEXT416(mask_stride_00),mask_stride_00,1);
  auVar1 = vpinsrd_avx(auVar1,mask_stride_00,2);
  auVar1 = vpinsrd_avx(auVar1,mask_stride_00,3);
  src1_00 = auVar1._8_8_;
  auVar5 = vpinsrd_avx(ZEXT416(mask_stride_00),mask_stride_00,1);
  auVar5 = vpinsrd_avx(auVar5,mask_stride_00,2);
  auVar5 = vpinsrd_avx(auVar5,mask_stride_00,3);
  auVar4 = vpinsrd_avx(ZEXT416(mask_stride_00),mask_stride_00,1);
  auVar4 = vpinsrd_avx(auVar4,mask_stride_00,2);
  auVar4 = vpinsrd_avx(auVar4,mask_stride_00,3);
  auVar4 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  local_80 = auVar4._0_8_;
  _local_120 = local_80;
  uVar2 = _local_120;
  src1_stride_02 = auVar1._4_4_;
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  src0_stride_01 = (uint32_t)((ulong)in_RDI >> 0x20);
  src1_stride_00 = (uint32_t)((ulong)in_R8 >> 0x20);
  src1_stride_01 = (uint32_t)((ulong)in_RDX >> 0x20);
  if ((h == 0) && (subw == 0)) {
    src0_stride_00 = auVar4._4_4_;
    _local_120 = uVar2;
    if (mask_stride == 4) {
      aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1
                (auVar5._8_8_,auVar5._4_4_,auVar4._8_8_,src0_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(mask_stride_00,CONCAT13(cVar7,in_stack_fffffffffffffed8))
                 ,4,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),(uint32_t)in_RDI,
                 mask_stride_00,auVar1._0_8_,auVar1._8_4_);
    }
    else if (mask_stride == 8) {
      aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1
                (auVar5._8_8_,auVar5._4_4_,auVar4._8_8_,src0_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(mask_stride_00,CONCAT13(cVar7,in_stack_fffffffffffffed8))
                 ,8,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),(uint32_t)in_RDI,
                 mask_stride_00,auVar1._0_8_,auVar1._8_4_);
    }
    else if (mask_stride == 0x10) {
      lowbd_blend_a64_d16_mask_subw0_subh0_w16_avx2
                ((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff38),src1_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(in_R9D,8),dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(iVar3,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14,(uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_)
                 ,w,(int)local_120,(__m256i *)CONCAT44(uVar6,iVar3),in_stack_fffffffffffffea8);
    }
    else {
      lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2
                ((uint8_t *)src1_00,src1_stride_02,
                 (CONV_BUF_TYPE *)CONCAT44(mask_stride_00,mask_stride_00),src0_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),src1_stride_01,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,mask_stride,
                 (int)local_120,(__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),
                 in_stack_fffffffffffffeb0);
    }
  }
  else if ((h == 1) && (subw == 1)) {
    if (mask_stride == 4) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1
                ((uint8_t *)CONCAT44(mask_stride_00,mask_stride_00),src0_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),src1_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_ECX,in_stack_ffffffffffffff38),src1_stride_00,
                 (uint8_t *)y_round_offset[1],(uint32_t)y_round_offset[2],(int)y_round_offset[3],
                 (__m128i *)CONCAT44(v_round_offset[0]._4_4_,(undefined4)v_round_offset[0]),
                 (int)v_round_offset[1]);
    }
    else if (mask_stride == 8) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1
                ((uint8_t *)CONCAT44(mask_stride_00,mask_stride_00),src0_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),src1_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_ECX,in_stack_ffffffffffffff38),src1_stride_00,
                 (uint8_t *)y_round_offset[1],(uint32_t)y_round_offset[2],(int)y_round_offset[3],
                 (__m128i *)CONCAT44(v_round_offset[0]._4_4_,(undefined4)v_round_offset[0]),
                 (int)v_round_offset[1]);
    }
    else if (mask_stride == 0x10) {
      lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2
                (unaff_R14,(uint32_t)((ulong)unaff_RBX >> 0x20),
                 (CONV_BUF_TYPE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 mask_stride_00,(CONV_BUF_TYPE *)CONCAT44(mask_stride_00,mask_stride_00),
                 mask_stride_00,(uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,
                 (int)local_120,(__m256i *)CONCAT44(uVar6,iVar3),in_stack_fffffffffffffea8);
    }
    else {
      lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2
                ((uint8_t *)CONCAT44(v_round_offset[1]._4_4_,(int)v_round_offset[1]),
                 v_round_offset[0]._4_4_,
                 (CONV_BUF_TYPE *)CONCAT44(y_round_offset[3]._4_4_,(int)y_round_offset[3]),
                 y_round_offset[2]._4_4_,(CONV_BUF_TYPE *)y_round_offset[1],y_round_offset[0]._4_4_,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,mask_stride,
                 (int)local_120,(__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),
                 in_stack_fffffffffffffeb0);
    }
  }
  else if ((h == 1) && (subw == 0)) {
    if (mask_stride == 4) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1
                ((uint8_t *)CONCAT44(in_R9D,8),dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(iVar3,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14,src1_00,src1_stride_02,unaff_R14,(uint32_t)unaff_R15,
                 (int)unaff_RBP,unaff_retaddr,in_stack_00000008);
    }
    else if (mask_stride == 8) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1
                ((uint8_t *)CONCAT44(in_R9D,8),dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(iVar3,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14,src1_00,src1_stride_02,unaff_R14,(uint32_t)unaff_R15,
                 (int)unaff_RBP,unaff_retaddr,in_stack_00000008);
    }
    else if (mask_stride == 0x10) {
      lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2
                ((uint8_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa0,auVar5._12_4_,auVar5._0_8_,auVar4._12_4_,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,0x10,(int)local_120,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),in_stack_fffffffffffffeb0);
    }
    else {
      lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2
                (mask,in_stack_0000000c,(CONV_BUF_TYPE *)unaff_retaddr,
                 (uint32_t)((ulong)unaff_RBP >> 0x20),unaff_R15,(uint32_t)((ulong)unaff_R14 >> 0x20)
                 ,(uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,mask_stride,
                 (int)local_120,(__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),
                 in_stack_fffffffffffffeb0);
    }
  }
  else if (mask_stride == 4) {
    aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1
              ((uint8_t *)CONCAT44(in_R9D,8),dst_stride_00,
               (CONV_BUF_TYPE *)CONCAT44(iVar3,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14,
               src1_00,src1_stride_02,(uint8_t *)CONCAT44(mask_stride_00,mask_stride_00),
               mask_stride_00,in_stack_ffffffffffffffd8,unaff_RBX,(int)unaff_R14);
  }
  else if (mask_stride == 8) {
    aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1
              ((uint8_t *)CONCAT44(in_R9D,8),dst_stride_00,
               (CONV_BUF_TYPE *)CONCAT44(iVar3,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14,
               src1_00,src1_stride_02,(uint8_t *)CONCAT44(mask_stride_00,mask_stride_00),
               mask_stride_00,in_stack_ffffffffffffffd8,unaff_RBX,(int)unaff_R14);
  }
  else if (mask_stride == 0x10) {
    lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2
              ((uint8_t *)src1_00,src1_stride_02,
               (CONV_BUF_TYPE *)CONCAT44(mask_stride_00,mask_stride_00),src0_stride_01,
               (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),src1_stride_01,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,0x10,(int)local_120,
               (__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),in_stack_fffffffffffffeb0);
  }
  else {
    lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2
              ((uint8_t *)CONCAT44(mask_stride_00,mask_stride_00),mask_stride_00,
               (CONV_BUF_TYPE *)CONCAT44(mask_stride_00,mask_stride_00),mask_stride_00,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe8c,mask._0_4_),w,mask_stride,
               (int)local_120,(__m256i *)CONCAT44(in_stack_fffffffffffffeac,iVar3),
               in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const __m256i y_round_offset = _mm256_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  }
}